

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool bitset_container_iterate64
                (bitset_container_t *cont,uint32_t base,roaring_iterator64 iterator,
                uint64_t high_bits,void *ptr)

{
  long lVar1;
  _Bool _Var2;
  uint64_t uVar3;
  int32_t i;
  ulong uVar4;
  
  for (uVar4 = 0; uVar4 != 0x400; uVar4 = uVar4 + 1) {
    uVar3 = cont->words[uVar4];
    while (uVar3 != 0) {
      lVar1 = 0;
      if (uVar3 != 0) {
        for (; (uVar3 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      _Var2 = (*iterator)((int)lVar1 + base | high_bits,ptr);
      uVar3 = uVar3 & uVar3 - 1;
      if (!_Var2) goto LAB_00108b12;
    }
    base = base + 0x40;
  }
LAB_00108b12:
  return 0x3ff < uVar4;
}

Assistant:

bool bitset_container_iterate64(const bitset_container_t *cont, uint32_t base, roaring_iterator64 iterator, uint64_t high_bits, void *ptr) {
  for (int32_t i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i ) {
    uint64_t w = cont->words[i];
    while (w != 0) {
      uint64_t t = w & (~w + 1);
      int r = __builtin_ctzll(w);
      if(!iterator(high_bits | (uint64_t)(r + base), ptr)) return false;
      w ^= t;
    }
    base += 64;
  }
  return true;
}